

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O2

void __thiscall
pbrt::ParallelFor2D(pbrt *this,Bounds2i *extent,function<void_(pbrt::Point2<int>)> *func)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:173:27)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel.h:173:27)>
             ::_M_manager;
  local_28._M_unused._M_object = extent;
  ParallelFor2D(this,(Bounds2i *)&local_28,(function<void_(pbrt::Bounds2<int>)> *)func);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

inline void ParallelFor2D(const Bounds2i &extent, std::function<void(Point2i)> func) {
    ParallelFor2D(extent, [&func](Bounds2i b) {
        for (Point2i p : b)
            func(p);
    });
}